

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int newstate(lua_State *L)

{
  lua_Alloc f_00;
  lua_State *L_00;
  lua_State *L1;
  lua_Alloc f;
  void *ud;
  lua_State *L_local;
  
  ud = L;
  f_00 = lua_getallocf(L,&f);
  L_00 = lua_newstate(f_00,f);
  if (L_00 == (lua_State *)0x0) {
    lua_pushnil((lua_State *)ud);
  }
  else {
    lua_atpanic(L_00,tpanic);
    lua_pushlightuserdata((lua_State *)ud,L_00);
  }
  return 1;
}

Assistant:

static int newstate (lua_State *L) {
  void *ud;
  lua_Alloc f = lua_getallocf(L, &ud);
  lua_State *L1 = lua_newstate(f, ud);
  if (L1) {
    lua_atpanic(L1, tpanic);
    lua_pushlightuserdata(L, L1);
  }
  else
    lua_pushnil(L);
  return 1;
}